

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

ForNonEnum<nonstd::expected_lite::unexpected_type<int>,_std::string> * __thiscall
lest::make_enum_string<nonstd::expected_lite::unexpected_type<int>>
          (ForNonEnum<nonstd::expected_lite::unexpected_type<int>,_std::string>
           *__return_storage_ptr__,lest *this,unexpected_type<int> *item)

{
  unexpected_type<int> *item_00;
  allocator<char> local_99;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"[type: ",&local_99);
  std::operator+(&local_78,&local_38,"N6nonstd13expected_lite15unexpected_typeIiEE");
  std::operator+(&local_58,&local_78,"]: ");
  make_memory_string<nonstd::expected_lite::unexpected_type<int>>(&local_98,this,item_00);
  std::operator+(__return_storage_ptr__,&local_58,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

auto make_enum_string( T const & item ) -> ForNonEnum<T, std::string>
{
#if lest__cpp_rtti
    return text("[type: ") + typeid(T).name() + "]: " + make_memory_string( item );
#else
    return text("[type: (no RTTI)]: ") + make_memory_string( item );
#endif
}